

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O0

void armci_stride_info_next(stride_info_t *sinfo)

{
  long in_RDI;
  bool bVar1;
  int i;
  int local_c;
  
  if (in_RDI == 0) {
    __assert_fail("sinfo!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                  ,0x60,"void armci_stride_info_next(stride_info_t *)");
  }
  if (*(int *)(in_RDI + 0x50) <= *(int *)(in_RDI + 0x54)) {
    __assert_fail("sinfo->pos <sinfo->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                  ,0x61,"void armci_stride_info_next(stride_info_t *)");
  }
  *(int *)(in_RDI + 0x54) = *(int *)(in_RDI + 0x54) + 1;
  if (0 < *(int *)(in_RDI + 8)) {
    *(int *)(in_RDI + 0x58) = *(int *)(in_RDI + 0x58) + 1;
    local_c = 0;
    while( true ) {
      bVar1 = false;
      if (local_c < *(int *)(in_RDI + 8) + -1) {
        bVar1 = *(int *)(in_RDI + 0x58 + (long)local_c * 4) ==
                *(int *)(in_RDI + 0x2c + (long)(local_c + 1) * 4);
      }
      if (!bVar1) break;
      *(undefined4 *)(in_RDI + 0x58 + (long)local_c * 4) = 0;
      *(int *)(in_RDI + 0x58 + (long)(local_c + 1) * 4) =
           *(int *)(in_RDI + 0x58 + (long)(local_c + 1) * 4) + 1;
      local_c = local_c + 1;
    }
    if (*(int *)(in_RDI + 0x2c + (long)(local_c + 1) * 4) <
        *(int *)(in_RDI + 0x58 + (long)local_c * 4)) {
      __assert_fail("sinfo->itr[i] <= sinfo->seg_count[i+1]",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                    ,0x69,"void armci_stride_info_next(stride_info_t *)");
    }
  }
  return;
}

Assistant:

void armci_stride_info_next(stride_info_t *sinfo) {
  int i;
  assert(sinfo!=NULL);
  assert(sinfo->pos <sinfo->size);
  sinfo->pos += 1;
  if(sinfo->stride_levels>0) {
    sinfo->itr[0] += 1;
    for(i=0; i<sinfo->stride_levels-1 && sinfo->itr[i]==sinfo->seg_count[i+1]; i++) {
      sinfo->itr[i] = 0;
      sinfo->itr[i+1] += 1;
    }
    assert(sinfo->itr[i] <= sinfo->seg_count[i+1]);
  }
}